

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::~ExtensionSet(ExtensionSet *this)

{
  KeyValue *flat;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  long lVar2;
  KeyValue *it_1;
  _Base_ptr *pp_Var3;
  
  if (this->arena_ != (Arena *)0x0) {
    return;
  }
  pp_Var3 = (_Base_ptr *)(this->map_).large;
  if (this->flat_capacity_ < 0x101) {
    for (lVar2 = (ulong)this->flat_size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
      Extension::Free((Extension *)(pp_Var3 + 1));
      pp_Var3 = pp_Var3 + 4;
    }
  }
  else {
    for (p_Var1 = pp_Var3[3]; p_Var1 != (_Rb_tree_node_base *)(pp_Var3 + 1);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      Extension::Free((Extension *)&p_Var1[1]._M_parent);
    }
  }
  flat = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    DeleteFlatMap(flat,0);
    return;
  }
  if (flat != (KeyValue *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                 *)flat);
  }
  operator_delete(flat);
  return;
}

Assistant:

ExtensionSet::~ExtensionSet() {
  // Deletes all allocated extensions.
  if (arena_ == NULL) {
    ForEach([](int /* number */, Extension& ext) { ext.Free(); });
    if (PROTOBUF_PREDICT_FALSE(is_large())) {
      delete map_.large;
    } else {
      DeleteFlatMap(map_.flat, flat_capacity_);
    }
  }
}